

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

ON_ModelComponentReference __thiscall
ONX_Model::Internal_AddModelComponent
          (ONX_Model *this,ON_ModelComponent *model_component,ON_UUID id,ON_UUID name_parent_id,
          ON_wString *name,bool bManagedComponent,bool bUpdateComponentIdentification)

{
  ON_UUID manifest_id;
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Type TVar6;
  int iVar7;
  int iVar8;
  ON_UUID *pOVar9;
  ON_Bitmap *this_00;
  ON_FileReference *file_reference;
  ON_NameHash *__src;
  wchar_t *component_name;
  ON_ModelGeometryComponent *this_01;
  ON_Object *p;
  ON_Light *pOVar10;
  ON_3dmObjectAttributes *pOVar11;
  ON__UINT64 component_serial_number;
  ON_ComponentManifestItem *this_02;
  ON_UUID *pOVar12;
  ON_ModelComponent *this_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  uchar name_00 [8];
  bool bVar14;
  ON_ModelComponentReference OVar15;
  byte in_stack_00000020;
  bool local_1bb;
  byte local_1ba;
  ON_ModelComponentReference local_180;
  undefined1 local_16d;
  undefined1 local_160 [16];
  ON_3dmObjectAttributes *attributes_1;
  ON_ModelGeometryComponent *model_geometry;
  ON_ManifestMapItem manifest_to_original;
  ON_ManifestMapItem original_to_manifest;
  ON_ComponentManifestItem *manifest_item;
  ON_3dmObjectAttributes *attributes;
  ON_Light *light;
  ON_ModelGeometryComponent *geometry_component;
  bool bUpdateName;
  bool bUpdateId;
  bool bUpdateIndex;
  bool bIndexRequired;
  int manifest_item_index;
  ON_NameHash name_hash;
  ON_NameHash original_name_hash;
  ON_Bitmap *embedded_file;
  undefined1 auStack_50 [7];
  bool bIsEmbeddedFileReference;
  ON_UUID original_id;
  int original_index;
  Type component_type;
  bool bUpdateComponentIdentification_local;
  bool bManagedComponent_local;
  ON_wString *name_local;
  ON_ModelComponent *model_component_local;
  ONX_Model *this_local;
  ON_UUID id_local;
  ON_ModelComponentReference *model_component_reference;
  
  name_00 = name_parent_id.Data4;
  id_local._0_8_ = name_parent_id._0_8_;
  this_local = (ONX_Model *)id.Data4;
  this_03 = id._0_8_;
  original_id.Data4[7] = bUpdateComponentIdentification;
  original_id.Data4[6] = in_stack_00000020 & 1;
  id_local.Data4 = (uchar  [8])this;
  if (this_03 == (ON_ModelComponent *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
               ,0x6ec,"","Invalid model_component parameter.");
  }
  else {
    bVar3 = ON_ModelComponent::IsSystemComponent(this_03);
    if (bVar3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                 ,0x6f2,"","Invalid model_component parameter.");
    }
    else {
      original_id.Data4[5] = ON_ModelComponent::ComponentType(this_03);
      bVar3 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(original_id.Data4[5]);
      if (bVar3) {
        original_id.Data4._0_4_ = ON_ModelComponent::Index(this_03);
        pOVar9 = ON_ModelComponent::Id(this_03);
        auStack_50._0_4_ = pOVar9->Data1;
        auStack_50._4_2_ = pOVar9->Data2;
        unique0x00012006 = pOVar9->Data3;
        original_id._0_8_ = *(undefined8 *)pOVar9->Data4;
        bVar3 = original_id.Data4[5] != '\x01';
        if (bVar3) {
          __src = ON_ModelComponent::NameHash(this_03);
          memcpy(name_hash.m_parent_id.Data4,__src,0x28);
        }
        else {
          this_00 = ON_Bitmap::Cast(&this_03->super_ON_Object);
          if (this_00 == (ON_Bitmap *)0x0) {
            memcpy(name_hash.m_parent_id.Data4,&ON_NameHash::UnsetNameHash,0x28);
          }
          else {
            file_reference = ON_Bitmap::FileReference(this_00);
            ON_NameHash::CreateFilePathHash
                      ((ON_NameHash *)name_hash.m_parent_id.Data4,file_reference);
          }
        }
        if (bVar3) {
          bVar4 = ON_ModelComponent::UniqueNameIgnoresCase(original_id.Data4[5]);
          ON_NameHash::Create((ON_NameHash *)&bUpdateName,(ON_UUID *)&name,(ON_wString *)name_00,
                              bVar4);
        }
        else {
          memcpy(&bUpdateName,name_hash.m_parent_id.Data4,0x28);
        }
        geometry_component._4_4_ = -0x7fffffff;
        bVar4 = ON_ModelComponent::IndexRequired(original_id.Data4[5]);
        if (((bVar4) &&
            (geometry_component._4_4_ =
                  ON_ComponentManifest::ComponentIndexLimit
                            ((ON_ComponentManifest *)&model_component[0xf].m_component_name_hash,
                             original_id.Data4[5]), 0x7ffffffe < geometry_component._4_4_)) &&
           ((original_id.Data4[6] & 1) != 0)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                     ,0x716,"","Unable to set model_component_index.");
        }
        else {
          bVar14 = false;
          if (((original_id.Data4[6] & 1) != 0) && (bVar14 = false, bVar4)) {
            bVar14 = original_id.Data4._0_4_ != geometry_component._4_4_;
          }
          local_1ba = 0;
          if ((original_id.Data4[6] & 1) != 0) {
            bVar5 = ::operator==((ON_UUID_struct *)auStack_50,(ON_UUID_struct *)&this_local);
            local_1ba = bVar5 ^ 0xff;
          }
          local_1ba = local_1ba & 1;
          local_1bb = false;
          if ((bVar3) && (local_1bb = false, (original_id.Data4[6] & 1) != 0)) {
            local_1bb = ::operator!=((ON_NameHash *)name_hash.m_parent_id.Data4,
                                     (ON_NameHash *)&bUpdateName);
          }
          if ((bVar14) && (bVar3 = ON_ModelComponent::IndexIsLocked(this_03), bVar3)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                       ,0x720,"","Unable to set component index.");
          }
          else if ((local_1ba == 0) || (bVar3 = ON_ModelComponent::IdIsLocked(this_03), !bVar3)) {
            if ((local_1bb == false) || (bVar3 = ON_ModelComponent::NameIsLocked(this_03), !bVar3))
            {
              if ((!bVar14) ||
                 (bVar3 = ON_ModelComponent::SetIndex(this_03,geometry_component._4_4_), bVar3)) {
                if ((local_1ba == 0) ||
                   (bVar3 = ON_ModelComponent::SetId(this_03,(ON_UUID *)&this_local), bVar3)) {
                  if (local_1bb != false) {
                    component_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)name_00);
                    bVar3 = ON_ModelComponent::SetName(this_03,component_name);
                    if (!bVar3) {
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                                 ,0x73a,"","model_component->SetName(...) failed.");
                      goto LAB_005f8b6a;
                    }
                  }
                  if (((original_id.Data4[6] & 1) != 0) &&
                     (this_01 = ON_ModelGeometryComponent::Cast(&this_03->super_ON_Object),
                     this_01 != (ON_ModelGeometryComponent *)0x0)) {
                    p = &ON_ModelGeometryComponent::Geometry(this_01,(ON_Geometry *)0x0)->
                         super_ON_Object;
                    pOVar10 = ON_Light::Cast(p);
                    if (pOVar10 != (ON_Light *)0x0) {
                      bVar3 = ::operator!=((ON_UUID_struct *)&this_local,&pOVar10->m_light_id);
                      if (bVar3) {
                        *(ONX_Model **)&pOVar10->m_light_id = this_local;
                        *(undefined8 *)(pOVar10->m_light_id).Data4 = id_local._0_8_;
                      }
                      bVar3 = ::operator!=((ON_wString *)name_00,&pOVar10->m_light_name);
                      if (bVar3) {
                        ON_wString::operator=(&pOVar10->m_light_name,(ON_wString *)name_00);
                      }
                    }
                    pOVar11 = ON_ModelGeometryComponent::Attributes
                                        (this_01,(ON_3dmObjectAttributes *)0x0);
                    if (pOVar11 != (ON_3dmObjectAttributes *)0x0) {
                      bVar3 = ::operator!=((ON_UUID_struct *)&this_local,&pOVar11->m_uuid);
                      if (bVar3) {
                        *(ONX_Model **)&pOVar11->m_uuid = this_local;
                        *(undefined8 *)(pOVar11->m_uuid).Data4 = id_local._0_8_;
                      }
                      bVar3 = ::operator!=((ON_wString *)name_00,&pOVar11->m_name);
                      if (bVar3) {
                        ON_wString::operator=(&pOVar11->m_name,(ON_wString *)name_00);
                      }
                    }
                  }
                  Internal_IncrementModelContentVersionNumber((ONX_Model *)model_component);
                  TVar6 = ON_ModelComponent::ComponentType(this_03);
                  component_serial_number = ON_ModelComponent::RuntimeSerialNumber(this_03);
                  manifest_id.Data4 = (uchar  [8])id_local._0_8_;
                  manifest_id._0_8_ = this_local;
                  this_02 = ON_ComponentManifest::AddComponentToManifest
                                      ((ON_ComponentManifest *)
                                       &model_component[0xf].m_component_name_hash,TVar6,
                                       component_serial_number,manifest_id,
                                       (ON_NameHash *)&bUpdateName);
                  bVar3 = ON_ComponentManifestItem::IsUnset(this_02);
                  if (bVar3) {
                    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                               ,0x761,"","Unable to update model manifest.");
                  }
                  else {
                    ON_ManifestMapItem::ON_ManifestMapItem
                              ((ON_ManifestMapItem *)manifest_to_original.m_destination_id.Data4);
                    bVar3 = ON_ManifestMapItem::SetSourceIdentification
                                      ((ON_ManifestMapItem *)
                                       manifest_to_original.m_destination_id.Data4,this_03);
                    if ((bVar3) &&
                       (bVar3 = ON_ManifestMapItem::SetDestinationIdentification
                                          ((ON_ManifestMapItem *)
                                           manifest_to_original.m_destination_id.Data4,this_02),
                       bVar3)) {
                      ON_ManifestMap::AddMapItem
                                ((ON_ManifestMap *)
                                 (model_component[0xf].m_component_name_hash.m_sha1_hash.m_digest +
                                 4),(ON_ManifestMapItem *)
                                    manifest_to_original.m_destination_id.Data4);
                    }
                    ON_ManifestMapItem::ON_ManifestMapItem((ON_ManifestMapItem *)&model_geometry);
                    bVar3 = ON_ManifestMapItem::SetSourceIdentification
                                      ((ON_ManifestMapItem *)&model_geometry,this_02);
                    if ((bVar3) &&
                       (bVar3 = ON_ManifestMapItem::SetDestinationIdentification
                                          ((ON_ManifestMapItem *)&model_geometry,this_03), bVar3)) {
                      ON_ManifestMap::AddMapItem
                                ((ON_ManifestMap *)
                                 (model_component[0xf].m_component_name_hash.m_sha1_hash.m_digest +
                                 0xc),(ON_ManifestMapItem *)&model_geometry);
                    }
                    if (bVar4) {
                      iVar7 = ON_ModelComponent::Index(this_03);
                      iVar8 = ON_ComponentManifestItem::Index(this_02);
                      if (((iVar7 == iVar8) ||
                          (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                                      ,0x775,"","Unexpected manifest_item_index value."), !bVar14))
                         || (bVar3 = ON_ModelComponent::SetIndex(this_03,geometry_component._4_4_),
                            bVar3)) {
LAB_005f899b:
                        TVar6 = ON_ModelComponent::ComponentType(this_03);
                        if (((TVar6 == ModelGeometry) &&
                            (attributes_1 = (ON_3dmObjectAttributes *)
                                            ON_ModelGeometryComponent::Cast
                                                      (&this_03->super_ON_Object),
                            attributes_1 != (ON_3dmObjectAttributes *)0x0)) &&
                           (local_160._8_8_ =
                                 ON_ModelGeometryComponent::Attributes
                                           ((ON_ModelGeometryComponent *)attributes_1,
                                            (ON_3dmObjectAttributes *)0x0),
                           (ON_3dmObjectAttributes *)local_160._8_8_ !=
                           (ON_3dmObjectAttributes *)0x0)) {
                          if (local_1ba != 0) {
                            pOVar12 = ON_ModelComponent::Id((ON_ModelComponent *)attributes_1);
                            uVar1 = pOVar12->Data2;
                            uVar2 = pOVar12->Data3;
                            pOVar9 = (ON_UUID *)(local_160._8_8_ + 0x10);
                            pOVar9->Data1 = pOVar12->Data1;
                            pOVar9->Data2 = uVar1;
                            pOVar9->Data3 = uVar2;
                            *(undefined8 *)((ON_UUID *)(local_160._8_8_ + 0x10))->Data4 =
                                 *(undefined8 *)pOVar12->Data4;
                          }
                          if (local_1bb != false) {
                            ON_ModelComponent::Name((ON_ModelComponent *)local_160);
                            ON_wString::operator=
                                      ((ON_wString *)(local_160._8_8_ + 0x20),
                                       (ON_wString *)local_160);
                            ON_wString::~ON_wString((ON_wString *)local_160);
                          }
                        }
                        if ((original_id.Data4[6] & 1) != 0) {
                          (*(this_03->super_ON_Object)._vptr_ON_Object[0xe])
                                    (this_03,&ON_ComponentManifest::Empty,
                                     &model_component[0xf].m_component_name_hash,
                                     model_component[0xf].m_component_name_hash.m_sha1_hash.m_digest
                                     + 4);
                        }
                        local_16d = 0;
                        ON_ModelComponentReference::CreateForExperts
                                  ((ON_ModelComponentReference *)this,this_03,
                                   (bool)(original_id.Data4[7] & 1));
                        ON_ModelComponentReference::ON_ModelComponentReference
                                  (&local_180,(ON_ModelComponentReference *)this);
                        Internal_AddModelComponentReference((ONX_Model *)model_component,&local_180)
                        ;
                        ON_ModelComponentReference::~ON_ModelComponentReference(&local_180);
                        _Var13._M_pi = extraout_RDX;
                        goto LAB_005f8b7d;
                      }
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                                 ,0x778,"","model_component->SetIndex(...) failed.");
                    }
                    else {
                      iVar7 = ON_ModelComponent::Index(this_03);
                      if (((iVar7 == -0x7fffffff) ||
                          (ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                                      ,0x781,"","Unexpected model_component->Index() value."),
                          !bVar14)) ||
                         (bVar3 = ON_ModelComponent::SetIndex(this_03,-0x7fffffff), bVar3)) {
                        iVar7 = ON_ComponentManifestItem::Index(this_02);
                        if (iVar7 != -0x7fffffff) {
                          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                                     ,0x78a,"","Unexpected manifest_item_index value.");
                        }
                        goto LAB_005f899b;
                      }
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                                 ,0x784,"","model_component->SetIndex(...) failed.");
                    }
                  }
                }
                else {
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                             ,0x735,"","model_component->SetId(...) failed.");
                }
              }
              else {
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                           ,0x730,"","model_component->SetIndex(...) failed.");
              }
            }
            else {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                         ,0x72a,"","Unable to set component name.");
            }
          }
          else {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                       ,0x725,"","Unable to set component id.");
          }
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x6f9,"","Invalid model_component parameter.");
      }
    }
  }
LAB_005f8b6a:
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
  _Var13._M_pi = extraout_RDX_00;
LAB_005f8b7d:
  OVar15.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  OVar15.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar15.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::Internal_AddModelComponent(
  ON_ModelComponent* model_component,
  ON_UUID id,
  ON_UUID name_parent_id,
  const ON_wString& name,
  bool bManagedComponent,
  bool bUpdateComponentIdentification
  )
{
  for (;;)
  {
    if (nullptr == model_component)
    {
      ON_ERROR("Invalid model_component parameter.");
      break;
    }

    if (model_component->IsSystemComponent())
    {
      ON_ERROR("Invalid model_component parameter.");
      break;
    }
    
    const ON_ModelComponent::Type component_type = model_component->ComponentType();
    if (!ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type))
    {
      ON_ERROR("Invalid model_component parameter.");
      break;
    }

    const int original_index = model_component->Index();
    const ON_UUID original_id = model_component->Id();
    const bool bIsEmbeddedFileReference = (ON_ModelComponent::Type::Image == component_type);
    const ON_Bitmap* embedded_file
      = bIsEmbeddedFileReference
      ? ON_Bitmap::Cast(model_component)
      : nullptr;

    const ON_NameHash original_name_hash 
      = bIsEmbeddedFileReference
      ? (nullptr == embedded_file ? ON_NameHash::UnsetNameHash : ON_NameHash::CreateFilePathHash(embedded_file->FileReference()) )
      : model_component->NameHash();

    const ON_NameHash name_hash 
      = bIsEmbeddedFileReference
      ? original_name_hash
      : ON_NameHash::Create(name_parent_id,name,ON_ModelComponent::UniqueNameIgnoresCase(component_type));

    int manifest_item_index = ON_UNSET_INT_INDEX;
    const bool bIndexRequired = ON_ModelComponent::IndexRequired(component_type);
    if (bIndexRequired)
    {
      manifest_item_index = m_manifest.ComponentIndexLimit(component_type);
      if (manifest_item_index >= 0x7FFFFFFF && bUpdateComponentIdentification)
      {
        ON_ERROR("Unable to set model_component_index.");
        break;
      }
    }
    const bool bUpdateIndex = (bUpdateComponentIdentification && bIndexRequired && original_index != (int)manifest_item_index);
    const bool bUpdateId = (bUpdateComponentIdentification && !(original_id == id));
    const bool bUpdateName = (false == bIsEmbeddedFileReference && bUpdateComponentIdentification && original_name_hash != name_hash);

    if (bUpdateIndex && model_component->IndexIsLocked())
    {
      ON_ERROR("Unable to set component index.");
      break;
    }
    if (bUpdateId && model_component->IdIsLocked())
    {
      ON_ERROR("Unable to set component id.");
      break;
    }
    if (bUpdateName && model_component->NameIsLocked())
    {
      ON_ERROR("Unable to set component name.");
      break;
    }

    if (bUpdateIndex && false == model_component->SetIndex((int)manifest_item_index))
    {
      ON_ERROR("model_component->SetIndex(...) failed.");
      break;
    }
    if(bUpdateId && false == model_component->SetId(id) )
    {
      ON_ERROR("model_component->SetId(...) failed.");
      break;
    }
    if(bUpdateName && false == model_component->SetName(name) )
    {
      ON_ERROR("model_component->SetName(...) failed.");
      break;
    }

    if (bUpdateComponentIdentification)
    {
      ON_ModelGeometryComponent* geometry_component = ON_ModelGeometryComponent::Cast(model_component);
      if (nullptr != geometry_component)
      {
        const ON_Light* light = ON_Light::Cast(geometry_component->Geometry(nullptr));
        if (nullptr != light)
        {
          if (id != light->m_light_id)
            const_cast<ON_Light*>(light)->m_light_id = id;
          if (name != light->m_light_name)
            const_cast<ON_Light*>(light)->m_light_name = name;
        }
        const ON_3dmObjectAttributes* attributes = geometry_component->Attributes(nullptr);
        if (nullptr != attributes)
        {
          if (id != attributes->m_uuid)
            const_cast<ON_3dmObjectAttributes*>(attributes)->m_uuid = id;
          if (name != attributes->m_name)
            const_cast<ON_3dmObjectAttributes*>(attributes)->m_name = name;
        }
      }
    }

    Internal_IncrementModelContentVersionNumber();

    const class ON_ComponentManifestItem& manifest_item = m_manifest.AddComponentToManifest(
      model_component->ComponentType(),
      model_component->RuntimeSerialNumber(),
      id,
      name_hash
      );
    
    if (manifest_item.IsUnset())
    {
      ON_ERROR("Unable to update model manifest.");
      break;
    }

    ON_ManifestMapItem original_to_manifest;
    if ( original_to_manifest.SetSourceIdentification(model_component) && original_to_manifest.SetDestinationIdentification(&manifest_item))
    {
      m_original_to_manifest_map.AddMapItem(original_to_manifest);
    }

    ON_ManifestMapItem manifest_to_original;
    if ( manifest_to_original.SetSourceIdentification(&manifest_item) && manifest_to_original.SetDestinationIdentification(model_component) )
    {
      m_manifest_to_original_map.AddMapItem(manifest_to_original);
    }

    if (bIndexRequired)
    {
      if (model_component->Index() != manifest_item.Index())
      {
        ON_ERROR("Unexpected manifest_item_index value.");
        if (bUpdateIndex && false == model_component->SetIndex((int)(manifest_item_index)))
        {
          ON_ERROR("model_component->SetIndex(...) failed.");
          break;
        }
      }
    }
    else
    {
      if (ON_ComponentManifest::UnsetComponentIndex != model_component->Index() )
      {
        ON_ERROR("Unexpected model_component->Index() value.");
        if (bUpdateIndex && false == model_component->SetIndex(ON_ComponentManifest::UnsetComponentIndex))
        {
          ON_ERROR("model_component->SetIndex(...) failed.");
          break;
        }
      }
      if ( ON_UNSET_INT_INDEX != manifest_item.Index() )
      {
        ON_ERROR("Unexpected manifest_item_index value.");
      }
    }

    if (ON_ModelComponent::Type::ModelGeometry == model_component->ComponentType())
    {
      ON_ModelGeometryComponent* model_geometry = ON_ModelGeometryComponent::Cast(model_component);
      if (nullptr != model_geometry)
      {
        // TEMPORARY - until the id and name can be removed from ON_3dmObjectAttributes,
        // they need to be synchronized with the ones on ON_ModelGeometryComponent.
        ON_3dmObjectAttributes* attributes = const_cast< ON_3dmObjectAttributes* >(model_geometry->Attributes(nullptr));
        if (nullptr != attributes)
        {
          if ( bUpdateId )
            attributes->m_uuid = model_geometry->Id();
          if (bUpdateName)
            attributes->m_name = model_geometry->Name();
        }
      }
    }
    
    if (bUpdateComponentIdentification)
    {
      // continue even when UpdateReferencedComponents() returns false
      model_component->UpdateReferencedComponents(ON_ComponentManifest::Empty,m_manifest,m_original_to_manifest_map);
    }

    ON_ModelComponentReference model_component_reference = ON_ModelComponentReference::CreateForExperts(model_component,bManagedComponent);
    Internal_AddModelComponentReference(model_component_reference);
    return model_component_reference;
  }

  return ON_ModelComponentReference::Empty;
}